

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O0

uint64_t basisu::pack_astc_range7_2bit_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint in_ECX;
  uint in_EDX;
  uint64_t *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  void *in_R9;
  uint32_t i_2;
  uint64_t total_err;
  uint32_t high;
  uint32_t low;
  uint32_t i_1;
  color_quad_u8 p;
  uint32_t i;
  endpoint_err *pEb;
  endpoint_err *pEg;
  endpoint_err *pEr;
  uint3 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  uint uVar3;
  color_quad_u8 *in_stack_ffffffffffffffa0;
  uint64_t uVar4;
  uint local_4c;
  color_quad_u8 local_48;
  uint local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  void *local_28;
  uint64_t *local_10;
  uint *local_8;
  
  uVar3 = (uint)in_stack_ffffffffffffff98;
  if (in_RDI[0xe] == 7) {
    uVar3 = CONCAT13(in_RDI[4] == 4,in_stack_ffffffffffffff98);
  }
  if ((char)(uVar3 >> 0x18) == '\0') {
    __assert_fail("pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x2c1,
                  "uint64_t basisu::pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *, color_cell_compressor_results *, uint32_t, uint32_t, uint32_t, uint8_t *)"
                 );
  }
  local_30 = g_astc_range7_2bit_optimal_endpoints + (ulong)in_EDX * 4;
  local_38 = g_astc_range7_2bit_optimal_endpoints + (ulong)in_ECX * 4;
  local_40 = g_astc_range7_2bit_optimal_endpoints + (ulong)in_R8D * 4;
  local_28 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  color_quad_u8_set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,uVar3,0,0x4a6a23);
  color_quad_u8_set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,uVar3,0,0x4a6a4f);
  *(undefined4 *)(local_10 + 2) = 0;
  *(undefined4 *)((long)local_10 + 0x14) = 0;
  for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
    *(undefined1 *)((long)local_10 + (ulong)local_44 + 0x28) =
         *(undefined1 *)
          ((ulong)local_8[0xe] * 0x200 + 0x704b61 +
          (ulong)*(byte *)((long)local_10 + (ulong)local_44 + 8) * 2);
    *(undefined1 *)((long)local_10 + (ulong)local_44 + 0x2c) =
         *(undefined1 *)
          ((ulong)local_8[0xe] * 0x200 + 0x704b61 +
          (ulong)*(byte *)((long)local_10 + (ulong)local_44 + 0xc) * 2);
  }
  memset(local_28,1,(ulong)*local_8);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    uVar1 = astc_interpolate_linear
                      ((uint)(byte)g_astc_sorted_order_unquant
                                   [(ulong)*(byte *)((long)local_10 + (ulong)local_4c + 8) * 2 +
                                    0xe00],
                       (uint)(byte)g_astc_sorted_order_unquant
                                   [(ulong)*(byte *)((long)local_10 + (ulong)local_4c + 0xc) * 2 +
                                    0xe00],0x15);
    local_48.m_c[local_4c] = (uint8_t)uVar1;
  }
  local_48.m_c[3] = 0xff;
  uVar4 = 0;
  for (uVar3 = 0; uVar3 < *local_8; uVar3 = uVar3 + 1) {
    uVar2 = compute_color_distance_rgb
                      (&local_48,(color_quad_u8 *)(*(long *)(local_8 + 2) + (ulong)uVar3 * 4),
                       *(bc7enc_bool *)((long)local_8 + 0x4f),local_8 + 0xf);
    uVar4 = uVar2 + uVar4;
  }
  *local_10 = uVar4;
  return uVar4;
}

Assistant:

static uint64_t pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	assert(pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4);

	const endpoint_err *pEr = &g_astc_range7_2bit_optimal_endpoints[r];
	const endpoint_err *pEg = &g_astc_range7_2bit_optimal_endpoints[g];
	const endpoint_err *pEb = &g_astc_range7_2bit_optimal_endpoints[b];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = 0;
	pResults->m_pbits[1] = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		pResults->m_astc_low_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_low_endpoint.m_c[i]].m_index;
		pResults->m_astc_high_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_high_endpoint.m_c[i]].m_index;
	}

	memset(pSelectors, BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = g_astc_sorted_order_unquant[7][pResults->m_low_endpoint.m_c[i]].m_unquant;
		uint32_t high = g_astc_sorted_order_unquant[7][pResults->m_high_endpoint.m_c[i]].m_unquant;
		
		p.m_c[i] = (uint8_t)astc_interpolate_linear(low, high, g_bc7_weights2[BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX]);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}